

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterFwd.hpp
# Opt level: O2

void __thiscall CLI::FormatterBase::FormatterBase(FormatterBase *this)

{
  _Rb_tree_header *p_Var1;
  
  this->_vptr_FormatterBase = (_func_int **)&PTR__FormatterBase_0019f9c8;
  this->column_width_ = 0x1e;
  this->right_column_width_ = 0x41;
  this->description_paragraph_width_ = 0x50;
  this->footer_paragraph_width_ = 0x50;
  p_Var1 = &(this->labels_)._M_t._M_impl.super__Rb_tree_header;
  *(undefined8 *)&(this->labels_)._M_t._M_impl = 0;
  *(undefined8 *)&(this->labels_)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (this->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->labels_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->labels_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  return;
}

Assistant:

FormatterBase() = default;